

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall TEST_PluginTest_Sequence_Test::testBody(TEST_PluginTest_Sequence_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_PluginTest_Sequence_Test *local_10;
  TEST_PluginTest_Sequence_Test *this_local;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  local_10 = this;
  (*pTVar1->_vptr_TestRegistry[0xd])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin);
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->preActionSequence == 1) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x91,pTVar6);
  }
  else {
    if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->preActionSequence !=
        ((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->preActionSequence) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1c])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x91);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_20);
    pcVar4 = SimpleString::asCharString(&local_20);
    StringFrom((int)local_40);
    pcVar5 = SimpleString::asCharString(local_40);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x91,pTVar6);
    SimpleString::~SimpleString(local_40);
    SimpleString::~SimpleString(&local_20);
  }
  if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->preActionSequence == 2) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x92,pTVar6);
  }
  else {
    if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->preActionSequence !=
        ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->preActionSequence) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1c])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x92);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_50);
    pcVar4 = SimpleString::asCharString(&local_50);
    StringFrom((int)&local_60);
    pcVar5 = SimpleString::asCharString(&local_60);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x92,pTVar6);
    SimpleString::~SimpleString(&local_60);
    SimpleString::~SimpleString(&local_50);
  }
  if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postActionSequence == 3) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x93,pTVar6);
  }
  else {
    if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postActionSequence !=
        ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postActionSequence) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1c])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x93);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_70);
    pcVar4 = SimpleString::asCharString(&local_70);
    StringFrom((int)&local_80);
    pcVar5 = SimpleString::asCharString(&local_80);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x93,pTVar6);
    SimpleString::~SimpleString(&local_80);
    SimpleString::~SimpleString(&local_70);
  }
  if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->postActionSequence == 4) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x94,pTVar6);
  }
  else {
    if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->postActionSequence !=
        ((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->postActionSequence) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1c])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x94);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_90);
    pcVar4 = SimpleString::asCharString(&local_90);
    StringFrom((int)&local_a0);
    pcVar5 = SimpleString::asCharString(&local_a0);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x94,pTVar6);
    SimpleString::~SimpleString(&local_a0);
    SimpleString::~SimpleString(&local_90);
  }
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0x12])()
  ;
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,2,(long)iVar2,"LONGS_EQUAL(2, registry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0x95,pTVar6);
  return;
}

Assistant:

TEST(PluginTest, Sequence)
{
    registry->installPlugin(thirdPlugin);
    genFixture->runAllTests();
    CHECK_EQUAL(1, thirdPlugin->preActionSequence);
    CHECK_EQUAL(2, firstPlugin->preActionSequence);
    CHECK_EQUAL(3, firstPlugin->postActionSequence);
    CHECK_EQUAL(4, thirdPlugin->postActionSequence);
    LONGS_EQUAL(2, registry->countPlugins());
}